

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float ImGui::SliderCalcRatioFromValueT<long_long,double>
                (ImGuiDataType data_type,longlong v,longlong v_min,longlong v_max,float power,
                float linear_zero_pos)

{
  long in_RCX;
  long in_RDX;
  longlong in_RSI;
  int in_EDI;
  float in_XMM0_Da;
  float fVar1;
  float in_XMM1_Da;
  float f_1;
  float f;
  longlong v_clamped;
  bool is_power;
  long local_50;
  bool local_42;
  float local_4;
  
  if (in_RDX == in_RCX) {
    local_4 = 0.0;
  }
  else {
    local_42 = false;
    if ((in_XMM0_Da != 1.0) || (NAN(in_XMM0_Da))) {
      local_42 = in_EDI == 4 || in_EDI == 5;
    }
    if (in_RDX < in_RCX) {
      local_50 = ImClamp<long_long>(in_RSI,in_RDX,in_RCX);
    }
    else {
      local_50 = ImClamp<long_long>(in_RSI,in_RCX,in_RDX);
    }
    if (local_42) {
      if (0.0 <= (float)local_50) {
        ImMax<long_long>(0,in_RDX);
        ImMax<long_long>(0,in_RDX);
        fVar1 = ImPow(0.0,2.248685e-39);
        local_4 = fVar1 * (1.0 - in_XMM1_Da) + in_XMM1_Da;
      }
      else {
        ImMin<long_long>(0,in_RCX);
        fVar1 = ImPow(0.0,2.248456e-39);
        local_4 = (1.0 - fVar1) * in_XMM1_Da;
      }
    }
    else {
      local_4 = (float)((double)(local_50 - in_RDX) / (double)(in_RCX - in_RDX));
    }
  }
  return local_4;
}

Assistant:

float ImGui::SliderCalcRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, float power, float linear_zero_pos)
{
    if (v_min == v_max)
        return 0.0f;

    const bool is_power = (power != 1.0f) && (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_power)
    {
        if (v_clamped < 0.0f)
        {
            const float f = 1.0f - (float)((v_clamped - v_min) / (ImMin((TYPE)0, v_max) - v_min));
            return (1.0f - ImPow(f, 1.0f/power)) * linear_zero_pos;
        }
        else
        {
            const float f = (float)((v_clamped - ImMax((TYPE)0, v_min)) / (v_max - ImMax((TYPE)0, v_min)));
            return linear_zero_pos + ImPow(f, 1.0f/power) * (1.0f - linear_zero_pos);
        }
    }

    // Linear slider
    return (float)((FLOATTYPE)(v_clamped - v_min) / (FLOATTYPE)(v_max - v_min));
}